

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

bool CheckSignatureEncoding
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *vchSig,uint flags,
               ScriptError *serror)

{
  long lVar1;
  size_type sVar2;
  uint in_ESI;
  long in_FS_OFFSET;
  ScriptError *unaff_retaddr;
  valtype *in_stack_00000008;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined7 in_stack_fffffffffffffff0;
  undefined1 in_stack_fffffffffffffff7;
  bool bVar3;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    (in_stack_ffffffffffffffc8);
  if (sVar2 == 0) {
    bVar3 = true;
  }
  else {
    if ((in_ESI & 0xe) != 0) {
      bVar3 = IsValidSignatureEncoding
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         CONCAT17(in_stack_fffffffffffffff7,in_stack_fffffffffffffff0));
      if (!bVar3) {
        bVar3 = anon_unknown.dwarf_15824b8::set_error
                          ((ScriptError *)in_stack_ffffffffffffffc8,SCRIPT_ERR_OK);
        goto LAB_00e86d1f;
      }
    }
    if ((in_ESI & 8) != 0) {
      bVar3 = IsLowDERSignature(in_stack_00000008,unaff_retaddr);
      if (!bVar3) {
        bVar3 = false;
        goto LAB_00e86d1f;
      }
    }
    if ((in_ESI & 2) != 0) {
      bVar3 = IsDefinedHashtypeSignature((valtype *)CONCAT44(in_ESI,in_stack_ffffffffffffffe0));
      if (!bVar3) {
        bVar3 = anon_unknown.dwarf_15824b8::set_error
                          ((ScriptError *)in_stack_ffffffffffffffc8,SCRIPT_ERR_OK);
        goto LAB_00e86d1f;
      }
    }
    bVar3 = true;
  }
LAB_00e86d1f:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool CheckSignatureEncoding(const std::vector<unsigned char> &vchSig, unsigned int flags, ScriptError* serror) {
    // Empty signature. Not strictly DER encoded, but allowed to provide a
    // compact way to provide an invalid signature for use with CHECK(MULTI)SIG
    if (vchSig.size() == 0) {
        return true;
    }
    if ((flags & (SCRIPT_VERIFY_DERSIG | SCRIPT_VERIFY_LOW_S | SCRIPT_VERIFY_STRICTENC)) != 0 && !IsValidSignatureEncoding(vchSig)) {
        return set_error(serror, SCRIPT_ERR_SIG_DER);
    } else if ((flags & SCRIPT_VERIFY_LOW_S) != 0 && !IsLowDERSignature(vchSig, serror)) {
        // serror is set
        return false;
    } else if ((flags & SCRIPT_VERIFY_STRICTENC) != 0 && !IsDefinedHashtypeSignature(vchSig)) {
        return set_error(serror, SCRIPT_ERR_SIG_HASHTYPE);
    }
    return true;
}